

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuMatrix.c
# Opt level: O3

void Fxu_MatrixAddSingle(Fxu_Matrix *p,Fxu_Var *pVar1,Fxu_Var *pVar2,int Weight)

{
  Fxu_Single *pLink;
  
  if (pVar1->iVar < pVar2->iVar) {
    pLink = (Fxu_Single *)Fxu_MemFetch(p,0x30);
    pLink->Num = 0;
    pLink->HNum = 0;
    *(undefined8 *)&pLink->Weight = 0;
    pLink->pVar1 = (Fxu_Var *)0x0;
    pLink->pVar2 = (Fxu_Var *)0x0;
    pLink->pPrev = (Fxu_Single *)0x0;
    pLink->pNext = (Fxu_Single *)0x0;
    pLink->Num = (p->lSingles).nItems;
    pLink->Weight = Weight;
    pLink->pVar1 = pVar1;
    pLink->pVar2 = pVar2;
    Fxu_ListMatrixAddSingle(p,pLink);
    Fxu_HeapSingleInsert(p->pHeapSingle,pLink);
    return;
  }
  __assert_fail("pVar1->iVar < pVar2->iVar",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxu/fxuMatrix.c"
                ,0x115,"void Fxu_MatrixAddSingle(Fxu_Matrix *, Fxu_Var *, Fxu_Var *, int)");
}

Assistant:

void Fxu_MatrixAddSingle( Fxu_Matrix * p, Fxu_Var * pVar1, Fxu_Var * pVar2, int Weight )
{
    Fxu_Single * pSingle;
    assert( pVar1->iVar < pVar2->iVar );
    pSingle = MEM_ALLOC_FXU( p, Fxu_Single, 1 );
    memset( pSingle, 0, sizeof(Fxu_Single) );
    pSingle->Num = p->lSingles.nItems;
    pSingle->Weight = Weight;
    pSingle->HNum = 0;
    pSingle->pVar1 = pVar1;
    pSingle->pVar2 = pVar2;
    Fxu_ListMatrixAddSingle( p, pSingle );
    // add to the heap
    Fxu_HeapSingleInsert( p->pHeapSingle, pSingle );
}